

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O1

void __thiscall toml::detail::location::location(location *this,string *source_name,string *cont)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  undefined1 local_41;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  vector<char,_std::allocator<char>_> *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  (this->super_region_base)._vptr_region_base = (_func_int **)&PTR__location_001c94b8;
  local_38._M_current = (cont->_M_dataplus)._M_p;
  local_40._M_current = local_38._M_current + cont->_M_string_length;
  local_30 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::vector<char,std::allocator<char>>,std::allocator<std::vector<char,std::allocator<char>>>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            (&local_28,&local_30,(allocator<std::vector<char,_std::allocator<char>_>_> *)&local_41,
             &local_38,&local_40);
  (this->source_).
  super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_30;
  (this->source_).
  super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->source_).
  super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_28._M_pi;
  this->line_number_ = 1;
  paVar1 = &(this->source_name_).field_2;
  (this->source_name_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (source_name->_M_dataplus)._M_p;
  paVar2 = &source_name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&source_name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->source_name_).field_2 + 8) = uVar4;
  }
  else {
    (this->source_name_)._M_dataplus._M_p = pcVar3;
    (this->source_name_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->source_name_)._M_string_length = source_name->_M_string_length;
  (source_name->_M_dataplus)._M_p = (pointer)paVar2;
  source_name->_M_string_length = 0;
  (source_name->field_2)._M_local_buf[0] = '\0';
  (this->iter_)._M_current =
       (((this->source_).
         super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  return;
}

Assistant:

location(std::string source_name, const std::string& cont)
      : source_(std::make_shared<std::vector<char>>(cont.begin(), cont.end())),
        line_number_(1), source_name_(std::move(source_name)), iter_(source_->cbegin())
    {}